

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

UBool __thiscall icu_63::TimeZoneFormat::operator==(TimeZoneFormat *this,Format *other)

{
  long lVar1;
  UChar32 *pUVar2;
  ushort uVar3;
  short sVar4;
  UBool UVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  UnicodeString *this_00;
  UnicodeString *text;
  bool bVar9;
  bool bVar10;
  
  UVar5 = Locale::operator==(&this->fLocale,(Locale *)(other + 1));
  if (UVar5 != '\0') {
    uVar3 = (this->fGMTPattern).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar3 & 1) == 0) {
      if ((short)uVar3 < 0) {
        iVar6 = (this->fGMTPattern).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)(short)uVar3 >> 5;
      }
      sVar4 = *(short *)(other[1].validLocale + 0x5b);
      if (sVar4 < 0) {
        iVar8 = *(int *)(other[1].validLocale + 0x5f);
      }
      else {
        iVar8 = (int)sVar4 >> 5;
      }
      if (((int)sVar4 & 1U) != 0) {
        return '\0';
      }
      if (iVar6 != iVar8) {
        return '\0';
      }
      UVar5 = UnicodeString::doEquals
                        (&this->fGMTPattern,(UnicodeString *)(other[1].validLocale + 0x53),iVar6);
      bVar10 = UVar5 != '\0';
    }
    else {
      bVar10 = (bool)(other[1].validLocale[0x5b] & 1);
    }
    if (bVar10 != false) {
      uVar3 = (this->fGMTZeroFormat).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar3 & 1) == 0) {
        if ((short)uVar3 < 0) {
          iVar6 = (this->fGMTZeroFormat).fUnion.fFields.fLength;
        }
        else {
          iVar6 = (int)(short)uVar3 >> 5;
        }
        sVar4 = *(short *)(other[3].actualLocale + 0x50);
        if (sVar4 < 0) {
          iVar8 = *(int *)(other[3].actualLocale + 0x54);
        }
        else {
          iVar8 = (int)sVar4 >> 5;
        }
        if (((int)sVar4 & 1U) != 0) {
          return '\0';
        }
        if (iVar6 != iVar8) {
          return '\0';
        }
        UVar5 = UnicodeString::doEquals
                          (&this->fGMTZeroFormat,(UnicodeString *)(other[3].actualLocale + 0x48),
                           iVar6);
        bVar10 = UVar5 != '\0';
      }
      else {
        bVar10 = (bool)(other[3].actualLocale[0x50] & 1);
      }
      if ((bVar10 != false) &&
         (iVar6 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[3])
                            (this->fTimeZoneNames,*(undefined8 *)(other[1].validLocale + 0x43)),
         (char)iVar6 != '\0')) {
        this_00 = (UnicodeString *)&this->field_0x280;
        text = (UnicodeString *)(other[1].validLocale + 0x93);
        uVar7 = 0;
        do {
          uVar3 = (this_00->fUnion).fStackFields.fLengthAndFlags;
          if ((uVar3 & 1) == 0) {
            if ((short)uVar3 < 0) {
              iVar6 = (this_00->fUnion).fFields.fLength;
            }
            else {
              iVar6 = (int)(short)uVar3 >> 5;
            }
            sVar4 = (text->fUnion).fStackFields.fLengthAndFlags;
            if (sVar4 < 0) {
              iVar8 = (text->fUnion).fFields.fLength;
            }
            else {
              iVar8 = (int)sVar4 >> 5;
            }
            if (((int)sVar4 & 1U) != 0) {
              return '\0';
            }
            if (iVar6 != iVar8) {
              return '\0';
            }
            UVar5 = UnicodeString::doEquals(this_00,text,iVar6);
            bVar10 = UVar5 != '\0';
          }
          else {
            bVar10 = (bool)(*(byte *)&text->fUnion & 1);
          }
          if (bVar10 == false) break;
          text = text + 1;
          this_00 = this_00 + 1;
          bVar9 = uVar7 < 5;
          uVar7 = uVar7 + 1;
        } while (bVar9);
        if (bVar10 != false) {
          uVar7 = 0;
          do {
            pUVar2 = this->fGMTOffsetDigits + uVar7;
            lVar1 = uVar7 * 4;
            if (8 < uVar7) break;
            uVar7 = uVar7 + 1;
          } while (*pUVar2 == *(int *)(other[3].actualLocale + lVar1 + 0x20));
          return *pUVar2 == *(int *)(other[3].actualLocale + lVar1 + 0x20);
        }
      }
    }
  }
  return '\0';
}

Assistant:

UBool
TimeZoneFormat::operator==(const Format& other) const {
    TimeZoneFormat* tzfmt = (TimeZoneFormat*)&other;

    UBool isEqual =
            fLocale == tzfmt->fLocale
            && fGMTPattern == tzfmt->fGMTPattern
            && fGMTZeroFormat == tzfmt->fGMTZeroFormat
            && *fTimeZoneNames == *tzfmt->fTimeZoneNames;

    for (int32_t i = 0; i < UTZFMT_PAT_COUNT && isEqual; i++) {
        isEqual = fGMTOffsetPatterns[i] == tzfmt->fGMTOffsetPatterns[i];
    }
    for (int32_t i = 0; i < 10 && isEqual; i++) {
        isEqual = fGMTOffsetDigits[i] == tzfmt->fGMTOffsetDigits[i];
    }
    // TODO
    // Check fTimeZoneGenericNames. For now,
    // if fTimeZoneNames is same, fTimeZoneGenericNames should
    // be also equivalent.
    return isEqual;
}